

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void baryonyx::itm::
     init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>
               (bit_array *x_pessimistic,bit_array *x_optimistic,random_engine *rng,
               quadratic_cost_type<float> *c,
               vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
               *constraints,double init_random)

{
  int iVar1;
  pointer pmVar2;
  pointer pfVar3;
  float *pfVar4;
  quad *pqVar5;
  bool bVar6;
  byte bVar7;
  undefined1 auVar8 [16];
  pointer prVar9;
  pointer prVar10;
  pointer pmVar11;
  ulong uVar12;
  int *piVar13;
  long unaff_RBX;
  merged_constraint *cst;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  size_type __n;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  float fVar31;
  double dVar32;
  undefined1 auVar33 [64];
  vector<reduced_cost,_std::allocator<reduced_cost>_> R;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  allocator_type local_71;
  ulong local_70;
  vector<reduced_cost,_std::allocator<reduced_cost>_> local_68;
  random_engine *local_50;
  quadratic_cost_type<float> *local_48;
  pointer local_40;
  double local_38;
  undefined1 auVar25 [32];
  
  pmVar11 = (constraints->
            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pmVar2 = (constraints->
           super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pmVar11 == pmVar2) {
    __n = 0;
  }
  else {
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxwd_avx2(_DAT_0062c790);
    lVar21 = -0x28 - (long)pmVar11;
    uVar12 = 0;
    auVar27 = vpbroadcastq_avx512f();
    auVar28 = vpsrlq_avx512f(auVar27,5);
    auVar27 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar33 = auVar27;
      auVar27 = vpbroadcastq_avx512f();
      uVar12 = uVar12 + 8;
      auVar27 = vporq_avx512f(auVar27,auVar26);
      uVar19 = vpcmpuq_avx512f(auVar27,auVar28,2);
      auVar27 = vpgatherdq_avx512f(*(undefined4 *)
                                    ((long)&(pmVar11->elements).
                                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                            ._M_impl.super__Vector_impl_data._M_finish + unaff_RBX))
      ;
      bVar7 = (byte)uVar19;
      auVar29._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * auVar27._8_8_;
      auVar29._0_8_ = (ulong)(bVar7 & 1) * auVar27._0_8_;
      auVar29._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * auVar27._16_8_;
      auVar29._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * auVar27._24_8_;
      auVar29._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * auVar27._32_8_;
      auVar29._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * auVar27._40_8_;
      auVar29._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * auVar27._48_8_;
      auVar29._56_8_ = (uVar19 >> 7) * auVar27._56_8_;
      auVar27 = vpgatherdq_avx512f(*(undefined4 *)
                                    ((long)&(pmVar11->elements).
                                            super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                            ._M_impl.super__Vector_impl_data._M_start + unaff_RBX));
      auVar30._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * auVar27._8_8_;
      auVar30._0_8_ = (ulong)(bVar7 & 1) * auVar27._0_8_;
      auVar30._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * auVar27._16_8_;
      auVar30._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * auVar27._24_8_;
      auVar30._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * auVar27._32_8_;
      auVar30._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * auVar27._40_8_;
      auVar30._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * auVar27._48_8_;
      auVar30._56_8_ = (uVar19 >> 7) * auVar27._56_8_;
      pmVar11 = pmVar11 + 8;
      auVar27 = vpsubq_avx512f(auVar29,auVar30);
      auVar27 = vpsrlq_avx512f(auVar27,3);
      auVar24 = vpmovqd_avx512f(auVar27);
      auVar24 = vpmaxsd_avx2(auVar33._0_32_,auVar24);
      auVar27 = ZEXT3264(auVar24);
    } while (((ulong)((long)pmVar2 + lVar21) / 0x28 + 8 & 0xfffffffffffffff8) != uVar12);
    auVar24 = vmovdqa32_avx512vl(auVar24);
    auVar23._0_4_ = (uint)(bVar7 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar33._0_4_;
    bVar6 = (bool)((byte)(uVar19 >> 1) & 1);
    auVar23._4_4_ = (uint)bVar6 * auVar24._4_4_ | (uint)!bVar6 * auVar33._4_4_;
    bVar6 = (bool)((byte)(uVar19 >> 2) & 1);
    auVar23._8_4_ = (uint)bVar6 * auVar24._8_4_ | (uint)!bVar6 * auVar33._8_4_;
    bVar6 = (bool)((byte)(uVar19 >> 3) & 1);
    auVar23._12_4_ = (uint)bVar6 * auVar24._12_4_ | (uint)!bVar6 * auVar33._12_4_;
    bVar6 = (bool)((byte)(uVar19 >> 4) & 1);
    auVar25._16_4_ = (uint)bVar6 * auVar24._16_4_ | (uint)!bVar6 * auVar33._16_4_;
    auVar25._0_16_ = auVar23;
    bVar6 = (bool)((byte)(uVar19 >> 5) & 1);
    auVar25._20_4_ = (uint)bVar6 * auVar24._20_4_ | (uint)!bVar6 * auVar33._20_4_;
    bVar6 = (bool)((byte)(uVar19 >> 6) & 1);
    auVar25._24_4_ = (uint)bVar6 * auVar24._24_4_ | (uint)!bVar6 * auVar33._24_4_;
    bVar6 = SUB81(uVar19 >> 7,0);
    auVar25._28_4_ = (uint)bVar6 * auVar24._28_4_ | (uint)!bVar6 * auVar33._28_4_;
    auVar23 = vpmaxsd_avx(auVar23,auVar25._16_16_);
    auVar8 = vpshufd_avx(auVar23,0xee);
    auVar23 = vpmaxsd_avx(auVar23,auVar8);
    auVar8 = vpshufd_avx(auVar23,0x55);
    auVar23 = vpmaxsd_avx(auVar23,auVar8);
    __n = CONCAT44((int)((ulong)x_optimistic >> 0x20),auVar23._0_4_);
  }
  local_50 = rng;
  local_48 = c;
  local_38 = init_random;
  std::vector<reduced_cost,_std::allocator<reduced_cost>_>::vector(&local_68,__n,&local_71);
  local_40 = (constraints->
             super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  pmVar11 = (constraints->
            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pmVar11 != local_40) {
    do {
      dVar32 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (local_50);
      if (dVar32 < local_38) {
        std::vector<reduced_cost,_std::allocator<reduced_cost>_>::resize
                  (&local_68,
                   (long)(pmVar11->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pmVar11->elements).
                         super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
        pfVar3 = (pmVar11->elements).
                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_70 = (ulong)((long)(pmVar11->elements).
                                 super__Vector_base<baryonyx::function_element,_std::allocator<baryonyx::function_element>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pfVar3) >> 3;
        if ((int)local_70 != 0) {
          pfVar4 = (local_48->linear_elements)._M_t.
                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl;
          pqVar5 = (local_48->quadratic_elements)._M_t.
                   super___uniq_ptr_impl<baryonyx::itm::quadratic_cost_type<float>::quad,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_std::default_delete<baryonyx::itm::quadratic_cost_type<float>::quad[]>_>
                   .super__Head_base<0UL,_baryonyx::itm::quadratic_cost_type<float>::quad_*,_false>.
                   _M_head_impl;
          piVar13 = (local_48->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>
                    ._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl;
          uVar12 = 0;
          do {
            iVar17 = pfVar3[uVar12].variable_index;
            fVar31 = pfVar4[iVar17];
            iVar14 = piVar13[iVar17];
            iVar1 = piVar13[(long)iVar17 + 1];
            if (iVar1 != iVar14) {
              lVar21 = 0;
              do {
                fVar31 = fVar31 + pqVar5[iVar14 + lVar21].factor;
                lVar21 = lVar21 + 1;
              } while (iVar1 - iVar14 != (int)lVar21);
            }
            local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12].value = fVar31;
            uVar19 = uVar12 + 1;
            local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12].factor = pfVar3[uVar12].factor;
            local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12].id = iVar17;
            uVar12 = uVar19;
          } while (uVar19 != (local_70 & 0xffffffff));
        }
        std::
        shuffle<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  ((__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                    )local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<reduced_cost_*,_std::vector<reduced_cost,_std::allocator<reduced_cost>_>_>
                    )local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_finish,local_50);
        prVar10 = local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        prVar9 = local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (int)LZCOUNT(((long)local_68.
                                         super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_68.
                                         super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 2) *
                                  -0x5555555555555555) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost*,std::vector<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost,std::allocator<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::reduced_cost>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::init_with_pre_solve<baryonyx::itm::quadratic_cost_type<float>,baryonyx::itm::minimize_tag>(baryonyx::bit_array&,baryonyx::bit_array&,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&,baryonyx::itm::quadratic_cost_type<float>const&,std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const&,double)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar9,prVar10);
        }
        if ((x_pessimistic->super_bit_array_impl).m_data._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          uVar20 = (uint)local_70;
          if (-1 < (int)uVar20) {
            uVar12 = 0;
            iVar17 = 0;
            piVar13 = &(local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                        _M_impl.super__Vector_impl_data._M_start)->factor;
LAB_0016c664:
            if ((iVar17 < pmVar11->min) || (pmVar11->max < iVar17)) goto LAB_0016c66e;
            if (-1 < (long)(uVar12 - 1)) {
              lVar21 = 8;
              uVar19 = uVar12;
              do {
                bit_array_impl::set(&x_pessimistic->super_bit_array_impl,
                                    *(int *)((long)&(local_68.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->value
                                            + lVar21));
                lVar21 = lVar21 + 0xc;
                uVar19 = uVar19 - 1;
              } while (uVar19 != 0);
              uVar20 = (uint)local_70;
              goto LAB_0016c6b7;
            }
          }
LAB_0016c6b4:
          uVar12 = 0;
LAB_0016c6b7:
          if ((uint)uVar12 != uVar20) {
            lVar21 = (uVar12 & 0xffffffff) * 0xc + 8;
            lVar22 = (uVar12 & 0xffffffff) - (local_70 & 0xffffffff);
            do {
              bit_array_impl::unset
                        (&x_pessimistic->super_bit_array_impl,
                         *(int *)((long)&(local_68.
                                          super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->value + lVar21
                                 ));
              lVar21 = lVar21 + 0xc;
              lVar22 = lVar22 + 1;
            } while (lVar22 != 0);
          }
        }
        uVar20 = (uint)local_70;
        if ((x_optimistic->super_bit_array_impl).m_data._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          if ((int)uVar20 < 0) {
LAB_0016c79f:
            uVar15 = 0;
          }
          else {
            uVar19 = (ulong)(uVar20 & 0x7fffffff);
            uVar18 = 0xffffffffffffffff;
            iVar17 = 0;
            piVar13 = &(local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                        _M_impl.super__Vector_impl_data._M_start)->factor;
            uVar12 = 0xfffffffe;
            do {
              uVar16 = uVar18 & 0xffffffff;
              if (pmVar11->max < iVar17) {
                uVar16 = uVar12;
              }
              if (iVar17 < pmVar11->min) {
                uVar16 = uVar12;
              }
              uVar18 = uVar18 + 1;
              iVar14 = (int)uVar16;
              if (((iVar14 != -2) && ((long)uVar18 < (long)uVar19)) &&
                 (0.0 < ((reduced_cost *)(piVar13 + -1))->value)) break;
              if ((long)uVar18 < (long)uVar19) {
                iVar17 = iVar17 + *piVar13;
              }
              piVar13 = piVar13 + 3;
              uVar12 = uVar16;
            } while (uVar19 != uVar18);
            if (iVar14 < 0) goto LAB_0016c79f;
            uVar15 = iVar14 + 1;
            lVar21 = 0;
            do {
              bit_array_impl::set(&x_optimistic->super_bit_array_impl,
                                  *(int *)((long)&(local_68.
                                                  super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->id +
                                          lVar21));
              lVar21 = lVar21 + 0xc;
            } while (uVar16 * 0xc + 0xc != lVar21);
            uVar20 = (uint)local_70;
          }
          if (uVar15 != uVar20) {
            lVar22 = (ulong)uVar15 - (ulong)uVar20;
            lVar21 = (ulong)uVar15 * 0xc + 8;
            do {
              bit_array_impl::unset
                        (&x_optimistic->super_bit_array_impl,
                         *(int *)((long)&(local_68.
                                          super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->value + lVar21
                                 ));
              lVar21 = lVar21 + 0xc;
              lVar22 = lVar22 + 1;
            } while (lVar22 != 0);
          }
        }
      }
      pmVar11 = pmVar11 + 1;
    } while (pmVar11 != local_40);
  }
  if (local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl.
      super__Vector_impl_data._M_start != (reduced_cost *)0x0) {
    operator_delete(local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<reduced_cost,_std::allocator<reduced_cost>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
LAB_0016c66e:
  if ((long)uVar12 < (long)(ulong)(uVar20 & 0x7fffffff)) {
    iVar17 = iVar17 + *piVar13;
  }
  uVar12 = uVar12 + 1;
  piVar13 = piVar13 + 3;
  if ((ulong)(uVar20 & 0x7fffffff) + 1 == uVar12) goto LAB_0016c6b4;
  goto LAB_0016c664;
}

Assistant:

void
init_with_pre_solve(bit_array& x_pessimistic,
                    bit_array& x_optimistic,
                    random_engine& rng,
                    const Cost& c,
                    const std::vector<merged_constraint>& constraints,
                    const double init_random) noexcept
{
    int max_length = 0;
    for (const auto& cst : constraints)
        if (length(cst.elements) > max_length)
            max_length = length(cst.elements);

    struct reduced_cost
    {
        float value;
        int factor;
        int id;
    };

    std::vector<reduced_cost> R(max_length);
    std::bernoulli_distribution dist(init_random);

    for (const auto& cst : constraints) {
        if (!dist(rng))
            continue;

        R.resize(cst.elements.size());
        const int r_size = length(cst.elements);

        for (int i = 0; i != r_size; ++i) {
            R[i].value = static_cast<float>(c[cst.elements[i].variable_index]);
            R[i].factor = cst.elements[i].factor;
            R[i].id = cst.elements[i].variable_index;
        }

        std::shuffle(std::begin(R), std::end(R), rng);
        std::sort(
          std::begin(R), std::end(R), [](const auto& lhs, const auto& rhs) {
              return is_better_solution<Mode>(lhs.value, rhs.value);
          });

        if (!x_pessimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max) {
                    best = i;
                    break;
                }

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_pessimistic.set(R[i].id);

            for (; i != r_size; ++i) {
                x_pessimistic.unset(R[i].id);
            }
        }

        if (!x_optimistic.empty()) {
            int sum = 0;
            int best = -2;

            for (int i = -1; i < r_size; ++i) {
                if (cst.min <= sum && sum <= cst.max)
                    best = i;

                if (best != -2 && i + 1 < r_size &&
                    stop_iterating<Mode>(R[i + 1].value))
                    break;

                if (i + 1 < r_size)
                    sum += R[i + 1].factor;
            }

            int i = 0;
            for (; i <= best; ++i)
                x_optimistic.set(R[i].id);

            for (; i != r_size; ++i)
                x_optimistic.unset(R[i].id);
        }
    }
}